

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

size_type __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
::erase<phmap::priv::hash_internal::EnumClass>
          (raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
           *this,key_arg<phmap::priv::hash_internal::EnumClass> *key)

{
  bool bVar1;
  iterator local_40;
  undefined1 local_30 [8];
  iterator it;
  key_arg<phmap::priv::hash_internal::EnumClass> *key_local;
  raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  *this_local;
  
  it.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)key;
  _local_30 = find<phmap::priv::hash_internal::EnumClass>(this,key);
  local_40 = end(this);
  bVar1 = priv::operator==((iterator *)local_30,&local_40);
  if (!bVar1) {
    _erase(this,_local_30);
  }
  this_local = (raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
                *)(ulong)!bVar1;
  return (size_type)this_local;
}

Assistant:

size_type erase(const key_arg<K>& key) {
        auto it = find(key);
        if (it == end()) return 0;
        _erase(it);
        return 1;
    }